

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Size SVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  ostream *poVar10;
  pointer pMVar11;
  Mat *pMVar12;
  ulong uVar13;
  _InputArray *p_Var14;
  long lVar15;
  int j_1;
  int i;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int j;
  long lVar20;
  int l;
  long lVar21;
  long lVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  CommandLineParser parser;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rois;
  long *local_7c0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels_log;
  undefined8 local_790;
  Mat *local_788;
  undefined8 local_780;
  int val;
  uint uStack_774;
  undefined8 local_770;
  Size local_768;
  long *local_730;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dy;
  Mat grad_iii;
  Mat reconstructed_img;
  byte bStack_697;
  byte bStack_696;
  int local_690;
  int iStack_68c;
  undefined8 *local_658;
  long *local_650;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_grad;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_channels;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  Mat img;
  int local_4b8;
  int iStack_4b4;
  long local_4b0;
  long *local_478;
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_log_channels;
  Mat edges_to_remove;
  long local_438;
  long *local_400;
  Mat S_lap;
  long *local_3a0;
  undefined8 local_388;
  string img1;
  string keys;
  undefined8 local_340;
  undefined8 local_338;
  Mat log_r_g;
  undefined8 *local_2f0;
  long *local_2e8;
  Mat log_b_g;
  long local_2c0;
  long *local_288;
  Mat S_x_dx;
  Mat filter_gx;
  Mat illuminant_invariant_img;
  Mat S_y_dy;
  Mat filter_gy;
  Mat illuminant_invariant_img_exp;
  
  cv::Mat::Mat(&filter_gx,1,3,5);
  pfVar9 = cv::Mat::at<float>(&filter_gx,0);
  *pfVar9 = -0.5;
  pfVar9 = cv::Mat::at<float>(&filter_gx,1);
  *pfVar9 = 0.0;
  pfVar9 = cv::Mat::at<float>(&filter_gx,2);
  *pfVar9 = 0.5;
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&filter_gy);
  cv::MatExpr::~MatExpr((MatExpr *)&reconstructed_img);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&keys,
             "{help h usage ? |      | print this message                                                        }{@image1        |      | image1 for compare                                                        }{roi            |      | roi to delete canny edges                                                 }{thrs1          |200   | Canny threshold for grayscale image                                       }{thrs2          |200   | Canny threshold for invariant image                                       }{c1             |0.5463| Illuminant invariant direction c1                                         }{c2             |-0.837| Illuminant invariant direction c2                                         }{calibrate      |false | Manually calibrate [c1, c2] direction                                     }{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
             ,(allocator<char> *)&reconstructed_img);
  cv::CommandLineParser::CommandLineParser(&parser,argc,argv,(string *)&keys);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reconstructed_img,"help",(allocator<char> *)&img);
  cVar5 = cv::CommandLineParser::has((string *)&parser);
  std::__cxx11::string::~string((string *)&reconstructed_img);
  if (cVar5 == '\0') {
    cv::CommandLineParser::get<std::__cxx11::string>(&img1,&parser,0,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"thrs1",(allocator<char> *)&img);
    fVar24 = cv::CommandLineParser::get<float>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"thrs2",(allocator<char> *)&img);
    fVar25 = cv::CommandLineParser::get<float>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"c1",(allocator<char> *)&img);
    fVar26 = cv::CommandLineParser::get<float>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"c2",(allocator<char> *)&img);
    fVar27 = cv::CommandLineParser::get<float>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"calibrate",(allocator<char> *)&img);
    bVar6 = cv::CommandLineParser::get<bool>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"mode",(allocator<char> *)&img);
    iVar7 = cv::CommandLineParser::get<int>(&parser,(String *)&reconstructed_img,true);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    cv::imread((string *)&img,(int)&img1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"Original",(allocator<char> *)&log_b_g);
    _log_r_g = 0x1010000;
    cv::imshow((string *)&reconstructed_img,(_InputArray *)&log_r_g);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    cv::Mat::Mat(&log_r_g,local_4b8,iStack_4b4,5);
    pMVar12 = (Mat *)0x5;
    cv::Mat::Mat(&log_b_g,local_4b8,iStack_4b4,5);
    for (lVar20 = 0; lVar20 < local_4b8; lVar20 = lVar20 + 1) {
      lVar21 = 0;
      for (lVar16 = 0; lVar16 < iStack_4b4; lVar16 = lVar16 + 1) {
        cv::Matx<unsigned_char,_3,_1>::Matx
                  ((Matx<unsigned_char,_3,_1> *)&reconstructed_img,
                   (uchar *)(*local_478 * lVar20 + local_4b0 + lVar21));
        *(undefined4 *)(*local_2e8 * lVar20 + lVar16 * 4) = 0;
        *(undefined4 *)(*local_288 * lVar20 + local_2c0 + lVar16 * 4) = 0;
        if (bStack_697 != 0) {
          uVar23 = (uint)bStack_697;
          if (bStack_696 != 0) {
            fVar28 = logf((float)bStack_696 / (float)uVar23);
            *(float *)(*local_2e8 * lVar20 + lVar16 * 4) = fVar28;
          }
          if (reconstructed_img != (Mat)0x0) {
            fVar28 = logf((float)(_reconstructed_img & 0xff) / (float)uVar23);
            *(float *)(*local_288 * lVar20 + local_2c0 + lVar16 * 4) = fVar28;
          }
        }
        lVar21 = lVar21 + 3;
      }
    }
    local_388 = CONCAT44((int)*local_2f0,(int)((ulong)*local_2f0 >> 0x20));
    cv::Mat::Mat(&illuminant_invariant_img,&local_388,5);
    main::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&log_r_g,&log_b_g,&illuminant_invariant_img,pMVar12,fVar26
               ,fVar27);
    cv::Mat::Mat(&illuminant_invariant_img_exp);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&edges_to_remove,"Invariant direction slider",
                 (allocator<char> *)&reconstructed_img);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&grad_iii,"ids",(allocator<char> *)&reconstructed_img);
      cv::namedWindow((string *)&edges_to_remove,1);
      _val = (ulong)uStack_774 << 0x20;
      pMVar12 = (Mat *)0x3e8;
      cv::createTrackbar((string *)&grad_iii,(string *)&edges_to_remove,&val,1000,onIDSslider,
                         (void *)0x0);
      uVar17 = 0xffffffffffffffff;
      bVar6 = false;
      while (!bVar6) {
        uVar13 = _val & 0xffffffff;
        if (val != (int)uVar17) {
          fVar26 = cosf(((float)val / 1000.0 + (float)val / 1000.0) * 3.141592);
          fVar27 = sinf(((float)val / 1000.0 + (float)val / 1000.0) * 3.141592);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar26);
          poVar10 = std::operator<<(poVar10,"   ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,fVar27);
          std::endl<char,std::char_traits<char>>(poVar10);
          main::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&log_r_g,&log_b_g,&illuminant_invariant_img,pMVar12,
                     fVar26,fVar27);
          rois.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          _reconstructed_img = 0x1010000;
          rois.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
          rois.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&illuminant_invariant_img_exp;
          cv::exp((_InputArray *)&reconstructed_img,(_OutputArray *)&rois);
          cv::operator/(&reconstructed_img,2.0);
          cv::_InputArray::_InputArray((_InputArray *)&rois,(MatExpr *)&reconstructed_img);
          cv::imshow((string *)&edges_to_remove,(_InputArray *)&rois);
          cv::MatExpr::~MatExpr((MatExpr *)&reconstructed_img);
          uVar17 = uVar13;
        }
        iVar8 = cv::waitKey(0x32);
        bVar6 = iVar8 == 0x1b;
      }
      std::__cxx11::string::~string((string *)&grad_iii);
      std::__cxx11::string::~string((string *)&edges_to_remove);
    }
    cv::Mat::Mat(&edges_to_remove);
    if (iVar7 == 1) {
      _val = 0;
      local_770 = (Mat *)CONCAT44(local_4b8,iStack_4b4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reconstructed_img,"roi",(allocator<char> *)&grad_iii);
      cVar5 = cv::CommandLineParser::has((string *)&parser);
      std::__cxx11::string::~string((string *)&reconstructed_img);
      if (cVar5 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&grad_iii,"roi",(allocator<char> *)&rois);
        cv::CommandLineParser::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &reconstructed_img,&parser,(String *)&grad_iii,true);
        std::__cxx11::string::~string((string *)&grad_iii);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&grad_iii,"x",(allocator<char> *)&S_x_dx);
        split(&rois,(string *)&reconstructed_img,(string *)&grad_iii);
        std::__cxx11::string::~string((string *)&grad_iii);
        if ((long)rois.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)CONCAT44(rois.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           rois.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) != 0x80) {
          __assert_fail("rois.size() == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/siposcsaba89[P]sriid/main.cpp"
                        ,0x8d,"int main(int, const char **)");
        }
        fVar25 = std::__cxx11::stof((string *)
                                    CONCAT44(rois.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             rois.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                    (size_t *)0x0);
        val = (int)(fVar25 * (float)(int)local_770);
        fVar25 = std::__cxx11::stof((string *)
                                    (CONCAT44(rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    0x20),(size_t *)0x0);
        _val = CONCAT44((int)(fVar25 * (float)local_770._4_4_),val);
        fVar25 = std::__cxx11::stof((string *)
                                    (CONCAT44(rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    0x40),(size_t *)0x0);
        local_770._0_4_ = (int)(fVar25 * (float)(int)local_770);
        fVar25 = std::__cxx11::stof((string *)
                                    (CONCAT44(rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              rois.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    0x60),(size_t *)0x0);
        local_770 = (Mat *)CONCAT44((int)(fVar25 * (float)local_770._4_4_),(int)local_770);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&rois);
        std::__cxx11::string::~string((string *)&reconstructed_img);
      }
      calculateShadowEdgesRoi(&img,(Rect *)&val,&edges_to_remove,(int)fVar24);
    }
    else if (iVar7 == 0) {
      calculateShadowEdges(&illuminant_invariant_img,&img,&edges_to_remove,(int)fVar25,(int)fVar24);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reconstructed_img,"Edges to remove",(allocator<char> *)&rois);
    _grad_iii = 0x1010000;
    cv::imshow((string *)&reconstructed_img,(_InputArray *)&grad_iii);
    std::__cxx11::string::~string((string *)&reconstructed_img);
    cv::waitKey(1);
    bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    _reconstructed_img = 0x1010000;
    log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    _grad_iii = 0x2050000;
    cv::split((_InputArray *)&reconstructed_img,(_OutputArray *)&grad_iii);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              (&bgr_channels_log,
               ((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              (&log_grad,
               ((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              (&log_dx,((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              (&log_dy,((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x60);
    uVar17 = 0;
    while( true ) {
      if ((ulong)(((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60) <= uVar17) break;
      cv::Mat::Mat(&reconstructed_img);
      lVar20 = uVar17 * 0x60;
      _grad_iii = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)
                         (bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start + lVar20),(int)&grad_iii,1.0,0.0);
      local_4e8 = CONCAT44((int)*local_658,(int)((ulong)*local_658 >> 0x20));
      cv::Mat::create(bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar20,&local_4e8,5);
      for (lVar16 = 0; local_690 = (int)&img, lVar16 < local_690; lVar16 = lVar16 + 1) {
        for (lVar21 = 0; iStack_68c = (int)((ulong)&img >> 0x20), lVar21 < iStack_68c;
            lVar21 = lVar21 + 1) {
          fVar24 = *(float *)(*local_650 * lVar16 + lVar21 * 4);
          uVar23 = -(uint)(fVar24 < 1.1920929e-07);
          fVar24 = logf((float)(uVar23 & 0x38d1b717 | ~uVar23 & (uint)fVar24));
          *(float *)(**(long **)(bgr_channels_log.
                                 super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar20 + 0x48) * lVar16 +
                     *(long *)(bgr_channels_log.
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar20 + 0x10) + lVar21 * 4) =
               fVar24;
        }
      }
      _grad_iii = 0x1010000;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar20);
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      local_768.width = 0;
      local_768.height = 0;
      val = 0x1010000;
      local_770 = &filter_gx;
      local_4c8 = 0xffffffffffffffff;
      cv::filter2D(0,(_InputArray *)&grad_iii,(_InputArray *)&rois,5,(_OutputArray *)&val,&local_4c8
                   ,4);
      _grad_iii = 0x1010000;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar20);
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      local_768.width = 0;
      local_768.height = 0;
      val = 0x1010000;
      local_770 = &filter_gy;
      local_4d0 = 0xffffffffffffffff;
      cv::filter2D(0,(_InputArray *)&grad_iii,(_InputArray *)&rois,5,(_OutputArray *)&val,&local_4d0
                   ,4);
      _grad_iii = 0x1010000;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar20);
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rois.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1010000;
      local_768.width = 0;
      local_768.height = 0;
      local_770 = log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar20;
      _val = CONCAT44(uStack_774,0x2010000);
      cv::magnitude((_InputArray *)&grad_iii,(_InputArray *)&rois,(_OutputArray *)&val);
      cv::Mat::~Mat(&reconstructed_img);
      uVar17 = uVar17 + 1;
    }
    cv::Mat::Mat(&grad_iii);
    cv::Mat::Mat(&reconstructed_img);
    cv::Mat::Mat((Mat *)&rois);
    local_768.width = 0;
    local_768.height = 0;
    val = 0x1010000;
    _S_x_dx = 0x2010000;
    _S_y_dy = 0x1010000;
    local_338 = 0xffffffffffffffff;
    local_770 = &illuminant_invariant_img;
    cv::filter2D(&val,&S_x_dx,5,&S_y_dy,&local_338,4);
    local_768.width = 0;
    local_768.height = 0;
    val = 0x1010000;
    _S_x_dx = 0x2010000;
    _S_y_dy = 0x1010000;
    local_340 = 0xffffffffffffffff;
    local_770 = &illuminant_invariant_img;
    cv::filter2D(&val,&S_x_dx,5,&S_y_dy,&local_340,4);
    local_768.width = 0;
    local_768.height = 0;
    val = 0x1010000;
    local_770 = &reconstructed_img;
    _S_x_dx = 0x1010000;
    _S_y_dy = 0x2010000;
    cv::magnitude((_InputArray *)&val,(_InputArray *)&S_x_dx,(_OutputArray *)&S_y_dy);
    cv::Mat::~Mat((Mat *)&rois);
    cv::Mat::~Mat(&reconstructed_img);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              (&re_log_channels,
               ((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&reconstructed_img);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              (&re_channels,
               ((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&reconstructed_img);
    for (uVar17 = 0;
        uVar17 < (ulong)(((long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar17 = uVar17 + 1) {
      lVar20 = uVar17 * 0x60;
      local_508 = CONCAT44((int)**(undefined8 **)
                                  (log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40),
                           (int)((ulong)**(undefined8 **)
                                          (log_dx.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40)
                                >> 0x20));
      cv::Mat::Mat((Mat *)&rois,&local_508,5);
      local_510 = CONCAT44((int)**(undefined8 **)
                                  (log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40),
                           (int)((ulong)**(undefined8 **)
                                          (log_dx.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40)
                                >> 0x20));
      cv::Mat::Mat((Mat *)&val,&local_510,5);
      uVar23 = *(uint *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20 + 8);
      if ((int)*(uint *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20 + 8) < 1) {
        uVar23 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar23; uVar13 = uVar13 + 1) {
        uVar4 = *(uint *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar20 + 0xc);
        if ((int)*(uint *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar20 + 0xc) < 1) {
          uVar4 = 0;
        }
        for (uVar18 = 0; uVar4 != uVar18; uVar18 = uVar18 + 1) {
          lVar16 = *local_730;
          if (*(byte *)(uVar18 + *local_400 * uVar13 + local_438) < 0x65) {
            *(undefined4 *)
             ((long)&((rois.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p +
             uVar18 * 4 + *local_7c0 * uVar13) =
                 *(undefined4 *)
                  (**(long **)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar20 + 0x48) * uVar13 +
                   *(long *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar20 + 0x10) + uVar18 * 4);
            uVar29 = *(undefined4 *)
                      (**(long **)(log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x48) *
                       uVar13 + *(long *)(log_dy.
                                          super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x10)
                      + uVar18 * 4);
          }
          else {
            *(undefined4 *)
             ((long)&((rois.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p +
             uVar18 * 4 + *local_7c0 * uVar13) = 0;
            uVar29 = 0;
          }
          *(undefined4 *)(lVar16 * uVar13 + (long)local_768 + uVar18 * 4) = uVar29;
        }
      }
      cv::Mat::Mat(&S_x_dx);
      cv::Mat::Mat(&S_y_dy);
      _reconstructed_img = 0x1010000;
      _S_lap = 0x2010000;
      local_780 = 0;
      local_790._0_4_ = 0x1010000;
      local_788 = &filter_gx;
      local_4d8 = 0xffffffffffffffff;
      cv::filter2D(0,&reconstructed_img,&S_lap,5,&local_790,&local_4d8,4);
      _reconstructed_img = 0x1010000;
      _S_lap = 0x2010000;
      local_780 = 0;
      local_790 = CONCAT44(local_790._4_4_,0x1010000);
      local_788 = &filter_gy;
      local_4e0 = 0xffffffffffffffff;
      cv::filter2D(0,&reconstructed_img,&S_lap,5,&local_790,&local_4e0,4);
      cv::operator+(&reconstructed_img,&S_x_dx);
      cv::MatExpr::operator_cast_to_Mat((MatExpr *)&S_lap);
      cv::MatExpr::~MatExpr((MatExpr *)&reconstructed_img);
      p_Var14 = (_InputArray *)
                (re_log_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar20);
      local_518 = CONCAT44((int)**(undefined8 **)
                                  (log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40),
                           (int)((ulong)**(undefined8 **)
                                          (log_dx.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40)
                                >> 0x20));
      cv::Mat::create(p_Var14,&local_518,5);
      local_790 = 0x4012d68f15c8a4a1;
      _reconstructed_img = 0xc1020006;
      cv::noArray();
      cv::Mat::setTo(p_Var14,(_InputArray *)&reconstructed_img);
      iVar7 = *(int *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar20 + 8);
      for (iVar8 = 0; iVar8 != 20000; iVar8 = iVar8 + 1) {
        lVar15 = 0;
        lVar16 = 4;
        for (lVar21 = 2; lVar21 < (long)iVar7 + -2; lVar21 = lVar21 + 1) {
          iVar1 = *(int *)(log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar20 + 0xc);
          for (lVar19 = 2; lVar19 < (long)iVar1 + -2; lVar19 = lVar19 + 1) {
            SVar2 = p_Var14->sz;
            lVar3 = **(long **)(p_Var14 + 3);
            lVar22 = lVar21 * lVar3 + (long)SVar2;
            fVar24 = *(float *)(lVar22 + lVar19 * 4);
            *(float *)(lVar22 + lVar19 * 4) =
                 ((fVar24 * -4.0 +
                  *(float *)(lVar22 + -8 + lVar19 * 4) + *(float *)(lVar22 + 8 + lVar19 * 4) +
                  *(float *)(lVar15 * lVar3 + (long)SVar2 + lVar19 * 4) +
                  *(float *)(lVar3 * lVar16 + (long)SVar2 + lVar19 * 4)) * 0.25 -
                 *(float *)(*local_3a0 * lVar21 + lVar19 * 4)) + fVar24;
          }
          lVar16 = lVar16 + 1;
          lVar15 = lVar15 + 1;
        }
      }
      local_520 = CONCAT44((int)**(undefined8 **)
                                  (log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40),
                           (int)((ulong)**(undefined8 **)
                                          (log_dx.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40)
                                >> 0x20));
      cv::Mat::create(re_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar20,&local_520,0);
      pMVar11 = log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar16 = 0; lVar16 < *(int *)(pMVar11 + lVar20 + 8); lVar16 = lVar16 + 1) {
        for (lVar21 = 0; lVar21 < *(int *)(pMVar11 + lVar20 + 0xc); lVar21 = lVar21 + 1) {
          fVar25 = expf(*(float *)(**(long **)(p_Var14 + 3) * lVar16 + (long)p_Var14->sz +
                                  lVar21 * 4));
          fVar24 = 255.0;
          if (fVar25 <= 255.0) {
            fVar24 = fVar25;
          }
          *(char *)(lVar21 + **(long **)(re_channels.
                                         super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x48) *
                             lVar16 + *(long *)(re_channels.
                                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                               lVar20 + 0x10)) = (char)(int)fVar24;
          pMVar11 = log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      cv::Mat::~Mat(&S_lap);
      cv::Mat::~Mat(&S_y_dy);
      cv::Mat::~Mat(&S_x_dx);
      cv::Mat::~Mat((Mat *)&val);
      cv::Mat::~Mat((Mat *)&rois);
    }
    cv::Mat::Mat(&reconstructed_img);
    rois.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_768.width = 0;
    local_768.height = 0;
    rois.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1050000;
    rois.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&re_channels;
    val = 0x2010000;
    local_770 = &reconstructed_img;
    cv::merge((_InputArray *)&rois,(_OutputArray *)&val);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rois,"reconstructed_img",(allocator<char> *)&S_x_dx);
    local_768.width = 0;
    local_768.height = 0;
    _val = CONCAT44(uStack_774,0x1010000);
    local_770 = &reconstructed_img;
    cv::imshow((string *)&rois,(_InputArray *)&val);
    std::__cxx11::string::~string((string *)&rois);
    cv::waitKey(0);
    cv::Mat::~Mat(&reconstructed_img);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&re_channels);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&re_log_channels);
    cv::Mat::~Mat(&grad_iii);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&log_dy);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&log_dx);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&log_grad);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&bgr_channels_log);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&bgr_channels);
    cv::Mat::~Mat(&edges_to_remove);
    cv::Mat::~Mat(&illuminant_invariant_img_exp);
    cv::Mat::~Mat(&illuminant_invariant_img);
    cv::Mat::~Mat(&log_b_g);
    cv::Mat::~Mat(&log_r_g);
    cv::Mat::~Mat(&img);
    std::__cxx11::string::~string((string *)&img1);
  }
  else {
    cv::CommandLineParser::printMessage();
  }
  cv::CommandLineParser::~CommandLineParser(&parser);
  std::__cxx11::string::~string((string *)&keys);
  cv::Mat::~Mat(&filter_gy);
  cv::Mat::~Mat(&filter_gx);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{

    cv::Mat filter_gx(1, 3, CV_32F);
    filter_gx.at<float>(0) = -0.5f;
    filter_gx.at<float>(1) = 0.0f;
    filter_gx.at<float>(2) = 0.5f;
    cv::Mat filter_gy = filter_gx.t();

    const std::string keys =
        "{help h usage ? |      | print this message                                                        }"
        "{@image1        |      | image1 for compare                                                        }"
        "{roi            |      | roi to delete canny edges                                                 }"
        "{thrs1          |200   | Canny threshold for grayscale image                                       }"
        "{thrs2          |200   | Canny threshold for invariant image                                       }"
        "{c1             |0.5463| Illuminant invariant direction c1                                         }"
        "{c2             |-0.837| Illuminant invariant direction c2                                         }"
        "{calibrate      |false | Manually calibrate [c1, c2] direction                                     }"
        "{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
        ;
    cv::CommandLineParser parser(argc, argv, keys);

    if (parser.has("help"))
    {
        parser.printMessage();
        return 0;
    }

    std::string img1 = parser.get<std::string>(0);
    float img_canny_thrs = parser.get<float>("thrs1");
    float ii_img_canny_thrs = parser.get<float>("thrs2");
    float c1 = parser.get<float>("c1");
    float c2 = parser.get<float>("c2");
    bool calibrate = parser.get<bool>("calibrate");
    int mode = parser.get<int>("mode");

    cv::Mat img = cv::imread(img1);
    //cv::Mat img2;
    //cv::resize(img, img2, cv::Size(img.cols / 2, img.rows / 2));
    //img = img2;
    cv::imshow("Original", img);

    cv::Mat log_r_g(img.rows, img.cols, CV_32F), log_b_g(img.rows, img.cols, CV_32F);
    for (int j = 0; j < img.rows; ++j)
    {
        for (int i = 0; i < img.cols; ++i)
        {
            cv::Vec3b color = img.at<cv::Vec3b>(j, i);
            log_r_g.at<float>(j, i) = 0;
            log_b_g.at<float>(j, i) = 0;
            if (color[1] != 0)
            {
                float scale = color[1];
                if (color[2] != 0)
                    log_r_g.at<float>(j, i) = std::log(color[2] / scale );
                if (color[0] != 0)
                    log_b_g.at<float>(j, i) = std::log(color[0] / scale);
            }
        }
    }

    auto combineLogImages = [](const cv::Mat& log_r_g, const cv::Mat& log_b_g, cv::Mat& img_res, const float c1, const float c2)
    {
        for (int j = 0; j < img_res.rows; ++j)
        {
            for (int i = 0; i < img_res.cols; ++i)
            {
                img_res.at<float>(j, i) = std::abs(c1 * log_r_g.at<float>(j, i) - c2 * log_b_g.at<float>(j, i));
            }
        }
    };

    cv::Mat illuminant_invariant_img(log_r_g.size(), CV_32F);
    combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
    cv::Mat illuminant_invariant_img_exp;

    if (calibrate)
    {
        //create trackbar window
        const std::string winname = "Invariant direction slider";
        const std::string slider_name = "ids";
        cv::namedWindow(winname, cv::WINDOW_AUTOSIZE); // Create Window
        int val = 0, val_curr = -1;

        int max_val = 1000;
        cv::createTrackbar(slider_name, winname, &val, max_val, onIDSslider);

        bool calib_done = false;
        while (!calib_done)
        {
            if (val != val_curr)
            {
                val_curr = val;
                c1 = std::cos(val / (float)max_val * 2 * 3.141592f);
                c2 = std::sin(val / (float)max_val * 2 * 3.141592f);
                std::cout << c1 << "   " << c2 << std::endl;
                combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
                cv::exp(illuminant_invariant_img, illuminant_invariant_img_exp);
                cv::imshow(winname, illuminant_invariant_img_exp / 2);
            }
            int key = cv::waitKey(50);
            if (key == 27)
            {
                calib_done = true;
            }
        }
    }
    cv::Mat edges_to_remove;
    if (mode == 0)
    {
        calculateShadowEdges(illuminant_invariant_img, img, edges_to_remove, int(ii_img_canny_thrs), int(img_canny_thrs));
    }
    else if (mode == 1)
    {
        cv::Rect roi(0, 0, img.cols, img.rows);
        if (parser.has("roi"))
        {
            std::string roi_str = parser.get<std::string>("roi");
            auto rois = split(roi_str, "x");
            assert(rois.size() == 4);
            roi.x = int(std::stof(rois[0]) * roi.width);
            roi.y = int(std::stof(rois[1]) * roi.height);
            roi.width = int(std::stof(rois[2]) * roi.width);
            roi.height = int(std::stof(rois[3]) * roi.height);
        }
        calculateShadowEdgesRoi(img, roi, edges_to_remove, int(img_canny_thrs));
    }
    cv::imshow("Edges to remove", edges_to_remove);
    cv::waitKey(1);
    //split color channels and calculate log (color/gradient magnitude) images
    std::vector<cv::Mat> bgr_channels, bgr_channels_log, log_grad, log_dx, log_dy;
    cv::split(img, bgr_channels);
    bgr_channels_log.resize(bgr_channels.size());
    log_grad.resize(bgr_channels.size());
    log_dx.resize(bgr_channels.size());
    log_dy.resize(bgr_channels.size());
    for (size_t i = 0; i < bgr_channels.size(); ++i)
    {
        cv::Mat float_img;
        bgr_channels[i].convertTo(float_img, CV_32F);
        bgr_channels_log[i].create(float_img.size(), CV_32FC1);
        for (int l = 0; l < float_img.rows; ++l)
        {
            for (int k = 0; k < float_img.cols; ++k)
            {
                float int_val = float_img.at<float>(l, k);
                if (int_val < std::numeric_limits<float>::epsilon())
                    int_val = 0.0001f;
                bgr_channels_log[i].at<float>(l, k) = std::log(int_val);
            }
        }
        cv::filter2D(bgr_channels_log[i], log_dx[i], CV_32F, filter_gx);
        cv::filter2D(bgr_channels_log[i], log_dy[i], CV_32F, filter_gy);
        cv::magnitude(log_dx[i], log_dy[i], log_grad[i]);
    }

    //calculate gradient of the illuminant invariant image
    cv::Mat grad_iii;
    {
        cv::Mat dx, dy;
        cv::filter2D(illuminant_invariant_img, dx, CV_32F, filter_gx);
        cv::filter2D(illuminant_invariant_img, dy, CV_32F, filter_gy);
        cv::magnitude(dx, dy, grad_iii);
    }
    //solving for color image
    std::vector<cv::Mat> re_log_channels(bgr_channels.size());
    std::vector<cv::Mat> re_channels(bgr_channels.size());
    //iterate over image channel and remove color edges belonging to shadows, restore original image channels
    for (size_t k = 0; k < bgr_channels.size(); ++k)
    {
        cv::Mat S_x(log_dx[k].size(), CV_32FC1);
        cv::Mat S_y(log_dx[k].size(), CV_32FC1);

        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                auto& s_x = S_x.at<float>(j, i);
                auto& s_y = S_y.at<float>(j, i);
                float edge_to_remove = edges_to_remove.at<uchar>(j, i);

                if (edge_to_remove > 100) //shadow edge
                {
                    s_x = 0;
                    s_y = 0;
                }
                else
                {
                    //std::cout << ii_grad << std::endl;
                    s_x = log_dx[k].at<float>(j, i);
                    s_y = log_dy[k].at<float>(j, i);
                }
            }
        }

        //calculate laplacian of the edge map, shadows already removed
        cv::Mat S_x_dx, S_y_dy;
        cv::filter2D(S_x, S_x_dx, CV_32F, filter_gx);
        cv::filter2D(S_y, S_y_dy, CV_32F, filter_gy);
        cv::Mat S_lap = S_x_dx + S_y_dy;

        cv::Mat& u = re_log_channels[k];

        //set boundary to some common value
        u.create(log_dx[k].size(), CV_32FC1);
        u.setTo(std::log(111));

        //lots of iteration required to restore the original image from the laplacian
        for (int it = 0; it < 20000; ++it)
        {
            for (int j = 2; j < log_dx[k].rows - 2; ++j)
            {
                for (int i = 2; i < log_dx[k].cols - 2; ++i)
                {
                    float lap_ = 
                        0.25f * (
                            u.at<float>(j, i - 2) + u.at<float>(j, i + 2) +
                        u.at<float>(j - 2, i) + u.at<float>(j + 2, i) -
                        4.0f * u.at<float>(j, i));
        
        
                    u.at<float>(j, i) +=
                        lap_ - S_lap.at<float>(j, i);
                }
            }
        }

        re_channels[k].create(log_dx[k].size(), CV_8UC1);
        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                re_channels[k].at<uint8_t>(j, i) = uint8_t(std::min(std::exp(u.at<float>(j, i)) * 1.f, 255.0f));
            }
        }
    }
    cv::Mat reconstructed_img;
    cv::merge(re_channels, reconstructed_img);

    cv::imshow("reconstructed_img", reconstructed_img);

    cv::waitKey(0);
    return 0;
}